

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void GCTM(lua_State *L,int propagateerrors)

{
  lu_byte lVar1;
  lu_byte lVar2;
  global_State *g_00;
  StkId pTVar3;
  undefined4 uVar4;
  code *local_78;
  char *msg;
  TValue *io1_1;
  TValue *io1;
  int running;
  lu_byte oldah;
  int status;
  GCObject *i_g;
  TValue *io;
  TValue v;
  TValue *tm;
  global_State *g;
  int propagateerrors_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  io = (TValue *)udata2finalize(g_00);
  v.value_.b = ((GCObject *)io)->tt | 0x40;
  v._8_8_ = luaT_gettmbyobj(L,(TValue *)&io,TM_GC);
  if (((TValue *)v._8_8_ != (TValue *)0x0) && ((((TValue *)v._8_8_)->tt_ & 0xfU) == 6)) {
    lVar1 = L->allowhook;
    lVar2 = g_00->gcrunning;
    L->allowhook = '\0';
    g_00->gcrunning = '\0';
    pTVar3 = L->top;
    pTVar3->value_ = ((TValue *)v._8_8_)->value_;
    uVar4 = *(undefined4 *)&((TValue *)v._8_8_)->field_0xc;
    pTVar3->tt_ = ((TValue *)v._8_8_)->tt_;
    *(undefined4 *)&pTVar3->field_0xc = uVar4;
    pTVar3 = L->top;
    pTVar3[1].value_.gc = (GCObject *)io;
    *(Value *)&pTVar3[1].tt_ = v.value_;
    L->top = L->top + 2;
    L->ci->callstatus = L->ci->callstatus | 0x100;
    running = luaD_pcall(L,dothecall,(void *)0x0,(long)L->top + (-0x20 - (long)L->stack),0);
    L->ci->callstatus = L->ci->callstatus & 0xfeff;
    L->allowhook = lVar1;
    g_00->gcrunning = lVar2;
    if ((running != 0) && (propagateerrors != 0)) {
      if (running == 2) {
        if ((L->top[-1].tt_ & 0xfU) == 4) {
          local_78 = L->top[-1].value_.f + 0x18;
        }
        else {
          local_78 = (code *)0x136dd0;
        }
        luaO_pushfstring(L,"error in __gc metamethod (%s)",local_78);
        running = 5;
      }
      luaD_throw(L,running);
    }
  }
  return;
}

Assistant:

static void GCTM(lua_State *L, int propagateerrors) {
    global_State *g = G(L);
    const TValue *tm;
    TValue v;
    setgcovalue(L, &v, udata2finalize(g));
    tm = luaT_gettmbyobj(L, &v, TM_GC);
    if (tm != NULL && ttisfunction(tm)) {  /* is there a finalizer? */
        int status;
        lu_byte oldah = L->allowhook;
        int running = g->gcrunning;
        L->allowhook = 0;  /* stop debug hooks during GC metamethod */
        g->gcrunning = 0;  /* avoid GC steps */
        setobj2s(L, L->top, tm);  /* push finalizer... */
        setobj2s(L, L->top + 1, &v);  /* ... and its argument */
        L->top += 2;  /* and (next line) call the finalizer */
        L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
        status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top - 2), 0);
        L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
        L->allowhook = oldah;  /* restore hooks */
        g->gcrunning = running;  /* restore state */
        if (status != LUA_OK && propagateerrors) {  /* error while running __gc? */
            if (status == LUA_ERRRUN) {  /* is there an error object? */
                const char *msg = (ttisstring(L->top - 1))
                                  ? svalue(L->top - 1)
                                  : "no message";
                luaO_pushfstring(L, "error in __gc metamethod (%s)", msg);
                status = LUA_ERRGCMM;  /* error in __gc metamethod */
            }
            luaD_throw(L, status);  /* re-throw error */
        }
    }
}